

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_neg_vec_aarch64(TCGContext_conflict1 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a)

{
  TCGOpcode *n;
  TCGv_vec a_00;
  TCGv_vec t;
  TCGOpcode *hold_list;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  tcg_assert_listed_vecop(INDEX_op_neg_vec);
  n = tcg_swap_vecop_list((TCGOpcode *)0x0);
  a_00 = tcg_const_zeros_vec_matching_aarch64(tcg_ctx,r);
  tcg_gen_sub_vec_aarch64(tcg_ctx,vece,r,a_00,a);
  tcg_temp_free_vec(tcg_ctx,a_00);
  tcg_swap_vecop_list(n);
  return;
}

Assistant:

void tcg_gen_neg_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a)
{
    const TCGOpcode *hold_list;

    tcg_assert_listed_vecop(INDEX_op_neg_vec);
    hold_list = tcg_swap_vecop_list(NULL);

    if (!TCG_TARGET_HAS_neg_vec || !do_op2(tcg_ctx, vece, r, a, INDEX_op_neg_vec)) {
        TCGv_vec t = tcg_const_zeros_vec_matching(tcg_ctx, r);
        tcg_gen_sub_vec(tcg_ctx, vece, r, t, a);
        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}